

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void Am_Standard_Print(ostream *out,unsigned_long val,Am_ID_Tag type)

{
  ostream *poVar1;
  void *pvVar2;
  Am_ID_Tag type_local;
  unsigned_long val_local;
  ostream *out_local;
  
  poVar1 = std::operator<<(out,"(TypeID=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,type);
  poVar1 = std::operator<<(poVar1,") ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,val);
  std::ostream::operator<<(pvVar2,std::dec);
  return;
}

Assistant:

void
Am_Standard_Print(std::ostream &out, unsigned long val, Am_ID_Tag type)
{
#ifdef DEBUG
  out << "(" << Am_Get_Type_Name(type) << ") " << std::hex << val << std::dec;
#else
  out << "(TypeID=" << type << ") " << std::hex << val << std::dec;
#endif
}